

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O1

QVariant * __thiscall
QMYSQLResult::data(QVariant *__return_storage_ptr__,QMYSQLResult *this,int field)

{
  QMetaTypeInterface *pQVar1;
  int *piVar2;
  double dVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulonglong uVar15;
  longlong lVar16;
  undefined8 *puVar17;
  ulong uVar18;
  undefined4 uVar19;
  char *pcVar20;
  long lVar21;
  long *plVar22;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  undefined8 uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  bool ok;
  qsizetype local_c8;
  QString local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar14 = *(long *)&this->field_0x8;
  cVar9 = QSqlResult::isSelect();
  if ((cVar9 == '\0') || (lVar21 = (long)field, *(long *)(lVar14 + 0xd0) <= lVar21)) {
    lcMysql();
    if (((byte)lcMysql::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      data((QMYSQLResult *)(ulong)(uint)field);
    }
LAB_0010a0b9:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    lVar12 = QSqlResult::driver();
    if (lVar12 == 0) goto LAB_0010a0b9;
    plVar22 = (long *)(lVar21 * 0x28 + *(long *)(lVar14 + 200));
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (storage_type_conflict *)0x0;
    local_b8.d.size = 0;
    if (*(char *)(lVar14 + 0xfd) == '\x01') {
      if ((char)plVar22[3] == '\x01') goto LAB_0010a198;
      if (*(int *)(plVar22[1] + 0x70) == 0x10) {
        lVar14 = *plVar22;
        local_58.shared = (PrivateShared *)(QArrayData *)0x0;
        if ((lVar14 != 0) && (uVar18 = *(long *)(plVar22[1] + 0x38) + 7, 7 < uVar18)) {
          local_58.shared = (PrivateShared *)(QArrayData *)0x0;
          uVar13 = 1;
          do {
            local_58.shared =
                 (PrivateShared *)
                 ((long)local_58.shared << 8 | (ulong)*(byte *)(lVar14 + -1 + uVar13));
            if (lVar14 == 0) break;
            bVar24 = uVar13 < uVar18 >> 3;
            uVar13 = uVar13 + 1;
          } while (bVar24);
        }
        QVariant::fromValue<unsigned_long,_true>
                  (__return_storage_ptr__,(unsigned_long *)local_58.data);
      }
      else {
        pQVar1 = (QMetaTypeInterface *)plVar22[2];
        if (pQVar1 == (QMetaTypeInterface *)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
          if (uVar10 == 0) {
            uVar10 = QMetaType::registerHelper(pQVar1);
          }
        }
        if ((uVar10 < 0x26) && ((0x360000003cU >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
          local_58._16_8_ = -0x5555555555555556;
          uStack_40 = 0xaaaaaaaaaaaaaaaa;
          local_58.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
          local_58._8_8_ = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
          QVariant::QVariant((QVariant *)&local_58,(QMetaTypeInterface *)plVar22[2],(void *)*plVar22
                            );
          pQVar1 = (QMetaTypeInterface *)plVar22[2];
          if (pQVar1 == (QMetaTypeInterface *)0x0) {
            iVar11 = 0;
          }
          else {
            iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
            if (iVar11 == 0) {
              iVar11 = QMetaType::registerHelper(pQVar1);
            }
          }
          if (iVar11 == 0x25) {
            uVar10 = QVariant::toUInt((bool *)local_58.data);
            QVariant::QVariant(__return_storage_ptr__,uVar10);
          }
          else {
            pQVar1 = (QMetaTypeInterface *)plVar22[2];
            if (pQVar1 == (QMetaTypeInterface *)0x0) {
              iVar11 = 0;
            }
            else {
              iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
              if (iVar11 == 0) {
                iVar11 = QMetaType::registerHelper(pQVar1);
              }
            }
            if (iVar11 == 0x22) {
              iVar11 = QVariant::toInt((bool *)local_58.data);
              QVariant::QVariant(__return_storage_ptr__,iVar11);
            }
            else {
              *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = local_58._16_8_;
              *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = uStack_40;
              (__return_storage_ptr__->d).data.shared = local_58.shared;
              *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = local_58._8_8_;
              local_58.shared = (PrivateShared *)0x0;
              local_58._8_8_ = (storage_type_conflict *)0x0;
              local_58._16_8_ = 0;
              uStack_40 = 2;
            }
          }
          goto LAB_0010a793;
        }
        if ((0xc < *(uint *)(plVar22[1] + 0x70)) ||
           (((0x1480U >> ((byte)*(uint *)(plVar22[1] + 0x70) & 0x1f) & 1) == 0 ||
            ((ulong)plVar22[4] < 0x28)))) {
          pQVar1 = (QMetaTypeInterface *)plVar22[2];
          if (pQVar1 == (QMetaTypeInterface *)0x0) {
            iVar11 = 0;
          }
          else {
            iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
            if (iVar11 == 0) {
              iVar11 = QMetaType::registerHelper(pQVar1);
            }
          }
          if (iVar11 != 0xc) {
            QString::fromUtf8((QString *)&local_58,(char *)*plVar22,plVar22[4]);
            uVar6 = local_58._16_8_;
            uVar23 = local_58.shared;
            pcVar5 = local_b8.d.ptr;
            pDVar4 = local_b8.d.d;
            local_58.shared = (PrivateShared *)local_b8.d.d;
            local_b8.d.d = (Data *)uVar23;
            local_b8.d.ptr = (char16_t *)local_58._8_8_;
            local_58._8_8_ = pcVar5;
            local_58._16_8_ = local_b8.d.size;
            local_b8.d.size = uVar6;
            if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
              }
            }
          }
          local_c8 = 0;
          goto LAB_0010a420;
        }
        piVar2 = (int *)*plVar22;
        pQVar1 = (QMetaTypeInterface *)plVar22[2];
        if (pQVar1 == (QMetaTypeInterface *)0x0) {
          iVar11 = 0;
        }
        else {
          iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
          if (iVar11 == 0) {
            iVar11 = QMetaType::registerHelper(pQVar1);
          }
        }
        if (iVar11 == 0xf) {
          uVar23 = -0x8000000000000000;
        }
        else {
          QDate::QDate((QDate *)&local_58.shared,*piVar2,piVar2[1],piVar2[2]);
          uVar23 = local_58.shared;
        }
        pQVar1 = (QMetaTypeInterface *)plVar22[2];
        if (pQVar1 == (QMetaTypeInterface *)0x0) {
          iVar11 = 0;
        }
        else {
          iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
          if (iVar11 == 0) {
            iVar11 = QMetaType::registerHelper(pQVar1);
          }
        }
        uVar19 = -1;
        if (iVar11 != 0xe) {
          QTime::QTime((QTime *)&local_58,piVar2[3],piVar2[4],piVar2[5],
                       (int)(*(ulong *)(piVar2 + 6) / 1000));
          uVar19 = local_58._0_4_;
        }
        pQVar1 = (QMetaTypeInterface *)plVar22[2];
        if (pQVar1 == (QMetaTypeInterface *)0x0) {
          iVar11 = 0;
        }
        else {
          iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
          if (iVar11 == 0) {
            iVar11 = QMetaType::registerHelper(pQVar1);
          }
        }
        if (iVar11 == 0x10) {
          local_78._forAlignment = 9.88131291682493e-324;
          QDateTime::QDateTime((QDateTime *)&local_58,uVar23,uVar19,&local_78,1);
          QVariant::QVariant(__return_storage_ptr__,(QDateTime *)local_58.data);
          QDateTime::~QDateTime((QDateTime *)local_58.data);
          QTimeZone::~QTimeZone((QTimeZone *)&local_78.shared);
        }
        else {
          pQVar1 = (QMetaTypeInterface *)plVar22[2];
          if (pQVar1 == (QMetaTypeInterface *)0x0) {
            iVar11 = 0;
          }
          else {
            iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
            if (iVar11 == 0) {
              iVar11 = QMetaType::registerHelper(pQVar1);
            }
          }
          if (iVar11 == 0xe) {
            QVariant::QVariant(__return_storage_ptr__,(QDate)uVar23);
          }
          else {
            QVariant::QVariant(__return_storage_ptr__,(QTime)uVar19);
          }
        }
      }
    }
    else if (*(long *)(*(long *)(lVar14 + 0xb8) + lVar21 * 8) == 0) {
LAB_0010a198:
      QVariant::QVariant(__return_storage_ptr__,(QMetaTypeInterface *)plVar22[2],(void *)0x0);
    }
    else if (*(int *)(plVar22[1] + 0x70) == 0x10) {
      lVar14 = *(long *)(*(long *)(lVar14 + 0xb8) + lVar21 * 8);
      local_58.shared = (PrivateShared *)(QArrayData *)0x0;
      if ((lVar14 != 0) && (uVar18 = *(long *)(plVar22[1] + 0x38) + 7, 7 < uVar18)) {
        local_58.shared = (PrivateShared *)(QArrayData *)0x0;
        uVar13 = 1;
        do {
          local_58.shared =
               (PrivateShared *)
               ((long)local_58.shared << 8 | (ulong)*(byte *)(lVar14 + -1 + uVar13));
          if (lVar14 == 0) break;
          bVar24 = uVar13 < uVar18 >> 3;
          uVar13 = uVar13 + 1;
        } while (bVar24);
      }
      if (_DAT_0011a254 == 0) {
        QMetaType::registerHelper
                  ((QMetaTypeInterface *)
                   &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long>::metaType);
      }
      QVariant::moveConstruct
                ((QMetaType)__return_storage_ptr__,
                 &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long>::metaType);
    }
    else {
      lVar12 = mysql_fetch_lengths(*(undefined8 *)(lVar14 + 0xb0));
      local_c8 = *(qsizetype *)(lVar12 + lVar21 * 8);
      pQVar1 = (QMetaTypeInterface *)plVar22[2];
      if (pQVar1 == (QMetaTypeInterface *)0x0) {
        iVar11 = 0;
      }
      else {
        iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar11 == 0) {
          iVar11 = QMetaType::registerHelper(pQVar1);
        }
      }
      if (iVar11 != 0xc) {
        QString::fromUtf8((QString *)&local_58,*(char **)(*(long *)(lVar14 + 0xb8) + lVar21 * 8),
                          local_c8);
        uVar6 = local_58._16_8_;
        uVar23 = local_58.shared;
        pcVar5 = local_b8.d.ptr;
        pDVar4 = local_b8.d.d;
        local_58.shared = (PrivateShared *)local_b8.d.d;
        local_b8.d.d = (Data *)uVar23;
        local_b8.d.ptr = (char16_t *)local_58._8_8_;
        local_58._8_8_ = pcVar5;
        local_58._16_8_ = local_b8.d.size;
        local_b8.d.size = uVar6;
        if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
          }
        }
      }
LAB_0010a420:
      pQVar1 = (QMetaTypeInterface *)plVar22[2];
      if (pQVar1 == (QMetaTypeInterface *)0x0) {
        iVar11 = 0;
      }
      else {
        iVar11 = (pQVar1->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar11 == 0) {
          iVar11 = QMetaType::registerHelper(pQVar1);
        }
      }
      switch(iVar11) {
      case 3:
switchD_0010a44f_caseD_3:
        QVar26.m_data = local_b8.d.ptr;
        QVar26.m_size = local_b8.d.size;
        uVar13 = QString::toIntegral_helper(QVar26,(bool *)0x0,10);
        uVar18 = 0;
        if (uVar13 < 0x100000000) {
          uVar18 = uVar13;
        }
        QVariant::QVariant(__return_storage_ptr__,(uint)uVar18);
        break;
      case 4:
        QVar25.m_data = local_b8.d.ptr;
        QVar25.m_size = local_b8.d.size;
        lVar16 = QString::toIntegral_helper(QVar25,(bool *)0x0,10);
        QVariant::QVariant(__return_storage_ptr__,lVar16);
        break;
      case 5:
        QVar28.m_data = local_b8.d.ptr;
        QVar28.m_size = local_b8.d.size;
        uVar15 = QString::toIntegral_helper(QVar28,(bool *)0x0,10);
        QVariant::QVariant(__return_storage_ptr__,uVar15);
        break;
      case 6:
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (storage_type_conflict *)0x0;
        local_58._16_8_ = 0;
        uStack_40 = 2;
        bVar24 = false;
        dVar3 = (double)QString::toDouble((bool *)&local_b8);
        iVar11 = QSqlResult::numericalPrecisionPolicy();
        if (iVar11 == 4) {
          this_00 = &local_78;
          QVariant::QVariant((QVariant *)this_00,dVar3);
          QVariant::operator=((QVariant *)&local_58,(QVariant *)this_00);
LAB_0010a715:
          QVariant::~QVariant((QVariant *)this_00);
        }
        else {
          if (iVar11 == 2) {
            QVariant::QVariant((QVariant *)&local_98,dVar3);
            lVar16 = QVariant::toLongLong((bool *)local_98.data);
            QVariant::QVariant((QVariant *)&local_78,lVar16);
LAB_0010a6df:
            this_00 = &local_98;
            QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
            QVariant::~QVariant((QVariant *)&local_78);
            goto LAB_0010a715;
          }
          if (iVar11 == 1) {
            QVariant::QVariant((QVariant *)&local_98,dVar3);
            iVar11 = QVariant::toInt((bool *)local_98.data);
            QVariant::QVariant((QVariant *)&local_78,iVar11);
            goto LAB_0010a6df;
          }
          QVariant::QVariant((QVariant *)&local_78,&local_b8);
          QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
          QVariant::~QVariant((QVariant *)&local_78);
          bVar24 = true;
        }
        if (bVar24) {
          puVar17 = &uStack_40;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = local_58._16_8_;
          *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = uStack_40;
          (__return_storage_ptr__->d).data.shared = local_58.shared;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = local_58._8_8_;
          local_58.shared = (PrivateShared *)0x0;
          local_58._8_8_ = (storage_type_conflict *)0x0;
          local_58._16_8_ = 0;
        }
        else {
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          puVar17 = (undefined8 *)&(__return_storage_ptr__->d).field_0x18;
        }
        *puVar17 = 2;
LAB_0010a793:
        QVariant::~QVariant((QVariant *)&local_58);
        break;
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xd:
switchD_0010a44f_caseD_7:
        QVariant::QVariant(__return_storage_ptr__,&local_b8);
        break;
      case 0xc:
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (storage_type_conflict *)0x0;
        local_58._16_8_ = 0;
        if (*(char *)(lVar14 + 0xfd) == '\x01') {
          pcVar20 = (char *)*plVar22;
          local_c8 = plVar22[4];
        }
        else {
          pcVar20 = *(char **)(*(long *)(lVar14 + 0xb8) + lVar21 * 8);
        }
        QByteArray::QByteArray((QByteArray *)&local_78,pcVar20,local_c8);
        uVar8 = local_58._8_8_;
        uVar7 = local_58.shared;
        uVar6 = local_78._16_8_;
        uVar23 = local_78.shared;
        local_78.shared = local_58.shared;
        local_58.shared = (PrivateShared *)uVar23;
        local_58._8_8_ = local_78._8_8_;
        local_78._8_8_ = uVar8;
        local_78._16_8_ = local_58._16_8_;
        local_58._16_8_ = uVar6;
        if ((QArrayData *)uVar7 != (QArrayData *)0x0) {
          LOCK();
          *(int *)uVar7 = *(int *)uVar7 + -1;
          UNLOCK();
          if (*(int *)uVar7 == 0) {
            QArrayData::deallocate((QArrayData *)uVar7,1,0x10);
          }
        }
        QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&local_58);
        if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58.shared = *(int *)local_58.shared + -1;
          UNLOCK();
          if (*(int *)local_58.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
          }
        }
        break;
      case 0xe:
        qDateFromString(__return_storage_ptr__,&local_b8);
        break;
      case 0xf:
        qTimeFromString(__return_storage_ptr__,&local_b8);
        break;
      case 0x10:
        qDateTimeFromString(__return_storage_ptr__,&local_b8);
        break;
      default:
        if (1 < iVar11 - 0x21U) {
          if (1 < iVar11 - 0x24U) goto switchD_0010a44f_caseD_7;
          goto switchD_0010a44f_caseD_3;
        }
      case 2:
        QVar27.m_data = local_b8.d.ptr;
        QVar27.m_size = local_b8.d.size;
        lVar14 = QString::toIntegral_helper(QVar27,(bool *)0x0,10);
        iVar11 = (int)lVar14;
        if ((int)lVar14 != lVar14) {
          iVar11 = 0;
        }
        QVariant::QVariant(__return_storage_ptr__,iVar11);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QMYSQLResult::data(int field)
{
    Q_D(QMYSQLResult);
    if (!isSelect() || field >= d->fields.size()) {
        qCWarning(lcMysql, "QMYSQLResult::data: column %d out of range", field);
        return QVariant();
    }

    if (!driver())
        return QVariant();

    my_ulonglong fieldLength = 0;
    const QMYSQLResultPrivate::QMyField &f = d->fields.at(field);
    QString val;
    if (d->preparedQuery) {
        if (f.nullIndicator)
            return QVariant(f.type);
        if (qIsBitfield(f.myField->type)) {
            return QVariant::fromValue(qDecodeBitfield(f, f.outField));
        } else if (qIsInteger(f.type.id())) {
            QVariant variant(f.type, f.outField);
            // we never want to return char variants here, see QTBUG-53397
            if (f.type.id() == QMetaType::UChar)
                return variant.toUInt();
            else if (f.type.id() == QMetaType::Char)
                return variant.toInt();
            return variant;
        } else if (qIsTimeOrDate(f.myField->type) && f.bufLength >= sizeof(QT_MYSQL_TIME)) {
            auto t = reinterpret_cast<const QT_MYSQL_TIME *>(f.outField);
            QDate date;
            QTime time;
            if (f.type.id() != QMetaType::QTime)
                date = QDate(t->year, t->month, t->day);
            if (f.type.id() != QMetaType::QDate)
                time = QTime(t->hour, t->minute, t->second, t->second_part / 1000);
            if (f.type.id() == QMetaType::QDateTime)
                return QDateTime(date, time, QTimeZone::UTC);
            else if (f.type.id() == QMetaType::QDate)
                return date;
            else
                return time;
        }

        if (f.type.id() != QMetaType::QByteArray)
            val = QString::fromUtf8(f.outField, f.bufLength);
    } else {
        if (d->row[field] == nullptr) {
            // NULL value
            return QVariant(f.type);
        }

        if (qIsBitfield(f.myField->type))
            return QVariant::fromValue(qDecodeBitfield(f, d->row[field]));

        fieldLength = mysql_fetch_lengths(d->result)[field];

        if (f.type.id() != QMetaType::QByteArray)
            val = QString::fromUtf8(d->row[field], fieldLength);
    }

    switch (f.type.id()) {
    case QMetaType::LongLong:
        return QVariant(val.toLongLong());
    case QMetaType::ULongLong:
        return QVariant(val.toULongLong());
    case QMetaType::Char:
    case QMetaType::Short:
    case QMetaType::Int:
        return QVariant(val.toInt());
    case QMetaType::UChar:
    case QMetaType::UShort:
    case QMetaType::UInt:
        return QVariant(val.toUInt());
    case QMetaType::Double: {
        QVariant v;
        bool ok=false;
        double dbl = val.toDouble(&ok);
        switch(numericalPrecisionPolicy()) {
            case QSql::LowPrecisionInt32:
                v=QVariant(dbl).toInt();
                break;
            case QSql::LowPrecisionInt64:
                v = QVariant(dbl).toLongLong();
                break;
            case QSql::LowPrecisionDouble:
                v = QVariant(dbl);
                break;
            case QSql::HighPrecision:
            default:
                v = val;
                ok = true;
                break;
        }
        if (ok)
            return v;
        return QVariant();
    }
    case QMetaType::QDate:
        return qDateFromString(val);
    case QMetaType::QTime:
        return qTimeFromString(val);
    case QMetaType::QDateTime:
        return qDateTimeFromString(val);
    case QMetaType::QByteArray: {

        QByteArray ba;
        if (d->preparedQuery) {
            ba = QByteArray(f.outField, f.bufLength);
        } else {
            ba = QByteArray(d->row[field], fieldLength);
        }
        return QVariant(ba);
    }
    case QMetaType::QString:
    default:
        return QVariant(val);
    }
    Q_UNREACHABLE();
}